

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

pair<subprocess::Buffer,_subprocess::Buffer> * __thiscall
subprocess::detail::Communication::communicate_threaded(Communication *this,char *msg,size_t length)

{
  long lVar1;
  bool bVar2;
  FILE *pFVar3;
  FILE *__s;
  OSError *this_00;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  string *in_RCX;
  void *in_RDX;
  char *in_RSI;
  pair<subprocess::Buffer,_subprocess::Buffer> *in_RDI;
  long in_FS_OFFSET;
  int res_1;
  int res;
  int wbytes;
  int length_conv;
  future<int> err_fut;
  future<int> out_fut;
  ErrBuffer ebuf;
  OutBuffer obuf;
  Streams *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  __shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffea8;
  int err_code;
  string *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Buffer::Buffer((Buffer *)in_stack_fffffffffffffe98);
  Buffer::Buffer((Buffer *)in_stack_fffffffffffffe98);
  std::future<int>::future((future<int> *)in_stack_fffffffffffffe98);
  std::future<int>::future((future<int> *)in_stack_fffffffffffffe98);
  iVar6 = (int)in_RCX;
  pFVar3 = Streams::output(in_stack_fffffffffffffe98);
  if (pFVar3 != (FILE *)0x0) {
    Buffer::add_cap((Buffer *)in_stack_fffffffffffffe98,0x81a38d);
    std::
    async<subprocess::detail::Communication::communicate_threaded(char_const*,unsigned_long)::_lambda()_1_>
              ((launch)((ulong)in_RSI >> 0x20),(type *)in_RDI);
    std::future<int>::operator=
              ((future<int> *)in_stack_fffffffffffffea8,
               (future<int> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::future<int>::~future((future<int> *)in_stack_fffffffffffffe98);
  }
  pFVar3 = Streams::error(in_stack_fffffffffffffe98);
  if (pFVar3 != (FILE *)0x0) {
    Buffer::add_cap((Buffer *)in_stack_fffffffffffffe98,0x81a42c);
    std::
    async<subprocess::detail::Communication::communicate_threaded(char_const*,unsigned_long)::_lambda()_2_>
              ((launch)((ulong)in_RSI >> 0x20),(type *)in_RDI);
    std::future<int>::operator=
              ((future<int> *)in_stack_fffffffffffffea8,
               (future<int> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::future<int>::~future((future<int> *)in_stack_fffffffffffffe98);
  }
  pFVar3 = Streams::input(in_stack_fffffffffffffe98);
  if (pFVar3 != (FILE *)0x0) {
    if (in_RDX != (void *)0x0) {
      __s = (FILE *)Streams::input(in_stack_fffffffffffffe98);
      this_00 = (OSError *)fwrite(in_RDX,1,(size_t)in_RCX,__s);
      err_code = (int)((ulong)in_RDX >> 0x20);
      in_stack_fffffffffffffec0 = in_RCX;
      if ((((int)this_00 < iVar6) &&
          (piVar4 = __errno_location(), in_stack_fffffffffffffec0 = in_RCX, *piVar4 != 0x20)) &&
         (piVar4 = __errno_location(), in_stack_fffffffffffffec0 = in_RCX, *piVar4 != 0x16)) {
        uVar5 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_RSI,
                   (allocator<char> *)in_RDI);
        __errno_location();
        OSError::OSError(this_00,in_RCX,err_code);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(uVar5,&OSError::typeinfo,OSError::~OSError);
        }
        goto LAB_0081a798;
      }
    }
    std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_fffffffffffffea8);
  }
  bVar2 = std::__basic_future<int>::valid((__basic_future<int> *)in_stack_fffffffffffffe98);
  if (bVar2) {
    in_stack_fffffffffffffea4 = std::future<int>::get((future<int> *)in_stack_fffffffffffffec0);
  }
  bVar2 = std::__basic_future<int>::valid((__basic_future<int> *)in_stack_fffffffffffffe98);
  if (bVar2) {
    in_stack_fffffffffffffea0 = std::future<int>::get((future<int> *)in_stack_fffffffffffffec0);
  }
  std::make_pair<subprocess::Buffer,subprocess::Buffer>
            ((Buffer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (Buffer *)in_stack_fffffffffffffe98);
  std::future<int>::~future((future<int> *)in_stack_fffffffffffffe98);
  std::future<int>::~future((future<int> *)in_stack_fffffffffffffe98);
  Buffer::~Buffer((Buffer *)in_stack_fffffffffffffe98);
  Buffer::~Buffer((Buffer *)in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
LAB_0081a798:
  __stack_chk_fail();
}

Assistant:

inline std::pair<OutBuffer, ErrBuffer>
  Communication::communicate_threaded(const char* msg, size_t length)
  {
    OutBuffer obuf;
    ErrBuffer ebuf;
    std::future<int> out_fut, err_fut;
    const int length_conv = length;

    if (stream_->output()) {
      obuf.add_cap(out_buf_cap_);

      out_fut = std::async(std::launch::async,
                          [&obuf, this] {
                            return util::read_all(this->stream_->output(), obuf.buf);
                          });
    }
    if (stream_->error()) {
      ebuf.add_cap(err_buf_cap_);

      err_fut = std::async(std::launch::async,
                          [&ebuf, this] {
                            return util::read_all(this->stream_->error(), ebuf.buf);
                          });
    }
    if (stream_->input()) {
      if (msg) {
        int wbytes = std::fwrite(msg, sizeof(char), length, stream_->input());
        if (wbytes < length_conv) {
          if (errno != EPIPE && errno != EINVAL) {
            throw OSError("fwrite error", errno);
          }
        }
      }
      stream_->input_.reset();
    }

    if (out_fut.valid()) {
      int res = out_fut.get();
      if (res != -1) obuf.length = res;
      else obuf.length = 0;
    }
    if (err_fut.valid()) {
      int res = err_fut.get();
      if (res != -1) ebuf.length = res;
      else ebuf.length = 0;
    }

    return std::make_pair(std::move(obuf), std::move(ebuf));
  }